

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omd2omd.cpp
# Opt level: O2

void createMdFile(string *oldMdFileName,string *newMdFileName,
                 vector<int,_std::allocator<int>_> *nMol)

{
  char *pcVar1;
  uint *puVar2;
  ostream *poVar3;
  ulong __n;
  ifstream oldMdFile;
  byte abStack_10420 [488];
  ofstream newMdFile;
  char buffer [65535];
  
  std::ifstream::ifstream(&oldMdFile);
  std::ofstream::ofstream(&newMdFile);
  std::ifstream::open((char *)&oldMdFile,(_Ios_Openmode)(oldMdFileName->_M_dataplus)._M_p);
  std::ofstream::open((char *)&newMdFile,(_Ios_Openmode)(newMdFileName->_M_dataplus)._M_p);
  std::istream::getline((char *)&oldMdFile,(long)buffer);
  __n = 0;
  while ((abStack_10420[*(long *)(_oldMdFile + -0x18)] & 2) == 0) {
    pcVar1 = strstr(buffer,"nMol");
    if (pcVar1 == (char *)0x0) {
      poVar3 = std::operator<<((ostream *)&newMdFile,buffer);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else if (__n < (ulong)((long)(nMol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_finish -
                           (long)(nMol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start >> 2)) {
      puVar2 = (uint *)std::vector<int,_std::allocator<int>_>::at(nMol,__n);
      snprintf(buffer,0xffff,"\tnMol = %i;",(ulong)*puVar2);
      poVar3 = std::operator<<((ostream *)&newMdFile,buffer);
      std::endl<char,std::char_traits<char>>(poVar3);
      __n = __n + 1;
    }
    std::istream::getline((char *)&oldMdFile,(long)buffer);
  }
  std::ifstream::close();
  std::ofstream::close();
  if (__n != (long)(nMol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(nMol->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2) {
    memcpy(&painCave,
           "Couldn\'t replace the correct number of nMol\n\tstatements in component blocks.",0x4d);
    painCave.isFatal = 1;
    simError();
  }
  std::ofstream::~ofstream(&newMdFile);
  std::ifstream::~ifstream(&oldMdFile);
  return;
}

Assistant:

void createMdFile(const std::string& oldMdFileName,
                  const std::string& newMdFileName, std::vector<int> nMol) {
  ifstream oldMdFile;
  ofstream newMdFile;
  const int MAXLEN = 65535;
  char buffer[MAXLEN];

  // create new .omd file based on old .omd file

  oldMdFile.open(oldMdFileName.c_str());
  newMdFile.open(newMdFileName.c_str());

  oldMdFile.getline(buffer, MAXLEN);

  std::size_t i = 0;
  while (!oldMdFile.eof()) {
    // correct molecule number
    if (strstr(buffer, "nMol") != NULL) {
      if (i < nMol.size()) {
        snprintf(buffer, MAXLEN, "\tnMol = %i;", nMol.at(i));
        newMdFile << buffer << std::endl;
        i++;
      }
    } else
      newMdFile << buffer << std::endl;

    oldMdFile.getline(buffer, MAXLEN);
  }

  oldMdFile.close();
  newMdFile.close();

  if (i != nMol.size()) {
    snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
             "Couldn't replace the correct number of nMol\n"
             "\tstatements in component blocks.");
    painCave.isFatal = 1;
    simError();
  }
}